

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.cpp
# Opt level: O2

void printBits(ostream *os,half h)

{
  int i;
  uint uVar1;
  
  for (uVar1 = 0xf; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
    std::operator<<(os,((h._h >> (uVar1 & 0x1f) & 1) != 0) + '0');
    if ((uVar1 == 0xf) || (uVar1 == 10)) {
      std::operator<<(os,' ');
    }
  }
  return;
}

Assistant:

IMATH_EXPORT void
printBits (ostream& os, half h)
{
    unsigned short b = h.bits ();

    for (int i = 15; i >= 0; i--)
    {
        os << (((b >> i) & 1) ? '1' : '0');

        if (i == 15 || i == 10) os << ' ';
    }
}